

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openjpeg.c
# Opt level: O1

OPJ_BOOL opj_setup_encoder(opj_codec_t *p_codec,opj_cparameters_t *parameters,opj_image_t *p_image)

{
  OPJ_BOOL OVar1;
  
  if ((p_image == (opj_image_t *)0x0 ||
       (parameters == (opj_cparameters_t *)0x0 || p_codec == (opj_codec_t *)0x0)) ||
     (*(int *)(p_codec + 0x12) != 0)) {
    OVar1 = 0;
  }
  else {
    OVar1 = (*(code *)p_codec[5])(p_codec[0xb],parameters,p_image,p_codec + 0xc);
  }
  return OVar1;
}

Assistant:

OPJ_BOOL OPJ_CALLCONV opj_setup_encoder(opj_codec_t *p_codec,
                                        opj_cparameters_t *parameters,
                                        opj_image_t *p_image)
{
    if (p_codec && parameters && p_image) {
        opj_codec_private_t * l_codec = (opj_codec_private_t *) p_codec;

        if (! l_codec->is_decompressor) {
            return l_codec->m_codec_data.m_compression.opj_setup_encoder(l_codec->m_codec,
                    parameters,
                    p_image,
                    &(l_codec->m_event_mgr));
        }
    }

    return OPJ_FALSE;
}